

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

ReferenceCounterValueType __thiscall Diligent::RefCountersImpl::AddStrongRef(RefCountersImpl *this)

{
  int iVar1;
  ObjectState OVar2;
  Char *pCVar3;
  atomic<int> *paVar4;
  undefined1 local_78 [8];
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  RefCountersImpl *this_local;
  
  msg.field_2._8_8_ = this;
  OVar2 = std::atomic<Diligent::RefCountersImpl::ObjectState>::load
                    (&this->m_ObjectState,memory_order_seq_cst);
  if (OVar2 != Alive) {
    FormatString<char[92]>
              ((string *)local_48,
               (char (*) [92])
               "Attempting to increment strong reference counter for a destroyed or not initialized object!"
              );
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"AddStrongRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
               ,0x33);
    std::__cxx11::string::~string((string *)local_48);
  }
  if ((this->m_ObjectWrapperBuffer[0] == 0) || (this->m_ObjectWrapperBuffer[1] == 0)) {
    FormatString<char[34]>((string *)local_78,(char (*) [34])"Object wrapper is not initialized");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"AddStrongRef",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/../../Common/interface/RefCountedObjectImpl.hpp"
               ,0x34);
    std::__cxx11::string::~string((string *)local_78);
  }
  paVar4 = &this->m_NumStrongReferences;
  LOCK();
  iVar1 = (paVar4->super___atomic_base<int>)._M_i;
  (paVar4->super___atomic_base<int>)._M_i = (paVar4->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  return iVar1 + 1;
}

Assistant:

inline virtual ReferenceCounterValueType AddStrongRef() override final
    {
        VERIFY(m_ObjectState.load() == ObjectState::Alive, "Attempting to increment strong reference counter for a destroyed or not initialized object!");
        VERIFY(m_ObjectWrapperBuffer[0] != 0 && m_ObjectWrapperBuffer[1] != 0, "Object wrapper is not initialized");
        return m_NumStrongReferences.fetch_add(+1) + 1;
    }